

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,ReadStream *r)

{
  pool_ptr<soul::heart::Expression> *this_00;
  Expression *pEVar1;
  char *s;
  CodePrinter *pCVar2;
  string *s_00;
  
  pCVar2 = this->out;
  this_00 = &(r->super_Assignment).target;
  pEVar1 = pool_ptr<soul::heart::Expression>::operator*(this_00);
  s = getAssignmentRole(this,pEVar1);
  choc::text::CodePrinter::operator<<(pCVar2,s);
  pEVar1 = pool_ptr<soul::heart::Expression>::operator*(this_00);
  printExpression(this,pEVar1);
  pCVar2 = choc::text::CodePrinter::operator<<(this->out," = read ");
  s_00 = Identifier::toString_abi_cxx11_(&(((r->source).object)->super_IODeclaration).name);
  choc::text::CodePrinter::operator<<(pCVar2,s_00);
  return;
}

Assistant:

void printDescription (const heart::ReadStream& r)
        {
            out << getAssignmentRole (*r.target);
            printExpression (*r.target);
            out << " = read " << r.source->name.toString();
        }